

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t local_1cc;
  size_t local_1b0;
  size_t consumed;
  uint8_t decryptbuf_small [256];
  ptls_buffer_t decryptbuf;
  uint8_t *src_end;
  uint8_t *src;
  size_t sendbuf_orig_off;
  undefined1 auStack_68 [4];
  int ret;
  st_ptls_record_message_emitter_t emitter;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *_sendbuf_local;
  ptls_t *tls_local;
  
  emitter.rec_start = (size_t)properties;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0x1202,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  init_record_message_emmitter(tls,(st_ptls_record_message_emitter_t *)auStack_68,_sendbuf);
  sVar1 = _auStack_68->off;
  if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
    if (tls->state == PTLS_STATE_CLIENT_HANDSHAKE_START) {
      if ((input != (void *)0x0) && (*inlen != 0)) {
        __assert_fail("input == NULL || *inlen == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0x120d,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
      if (*tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t *)0x0) {
        iVar2 = send_client_hello(tls,(ptls_message_emitter_t *)auStack_68,
                                  (ptls_handshake_properties_t *)emitter.rec_start,
                                  (ptls_iovec_t *)0x0);
        return iVar2;
      }
      __assert_fail("tls->ctx->key_exchanges[0] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x120e,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  else {
    msg("ptls_handshake - in handshake");
  }
  puVar3 = (uint8_t *)((long)input + *inlen);
  ptls_buffer_init((ptls_buffer_t *)(decryptbuf_small + 0xf8),&consumed,0x100);
  sendbuf_orig_off._4_4_ = 0x202;
  src_end = (uint8_t *)input;
  while (sendbuf_orig_off._4_4_ == 0x202 && src_end != puVar3) {
    local_1b0 = (long)puVar3 - (long)src_end;
    sendbuf_orig_off._4_4_ =
         handle_input(tls,(ptls_message_emitter_t *)auStack_68,
                      (ptls_buffer_t *)(decryptbuf_small + 0xf8),src_end,&local_1b0,
                      (ptls_handshake_properties_t *)emitter.rec_start);
    if ((((byte)tls->field_0x160 >> 5 & 1) != 0) && (local_1b0 != 0)) break;
    src_end = src_end + local_1b0;
    if (decryptbuf.capacity != 0) {
      __assert_fail("decryptbuf.off == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x1223,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)(decryptbuf_small + 0xf8));
  if (((sendbuf_orig_off._4_4_ != 0) && (sendbuf_orig_off._4_4_ != 0x202)) &&
     (sendbuf_orig_off._4_4_ != 0x206)) {
    (*ptls_clear_memory)(_auStack_68->base + sVar1,_auStack_68->off - sVar1);
    _auStack_68->off = sVar1;
    if ((sendbuf_orig_off._4_4_ & 0xffffff00) != 0x100) {
      if ((sendbuf_orig_off._4_4_ & 0xffffff00) == 0) {
        local_1cc = (uint8_t)sendbuf_orig_off._4_4_;
      }
      else {
        local_1cc = 'P';
      }
      iVar2 = ptls_send_alert(tls,_auStack_68,'\x02',local_1cc);
      if (iVar2 != 0) {
        _auStack_68->off = sVar1;
      }
    }
  }
  if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
    *inlen = *inlen - ((long)puVar3 - (long)src_end);
  }
  return sendbuf_orig_off._4_4_;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emmitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    if (tls->in_handshake)
        msg("ptls_handshake - in handshake");
    else
        /* special handlings */
        switch (tls->state) {
        case PTLS_STATE_CLIENT_HANDSHAKE_START: {
            assert(input == NULL || *inlen == 0);
            assert(tls->ctx->key_exchanges[0] != NULL);
            return send_client_hello(tls, &emitter.super, properties, NULL);
        }
        default:
            break;
        }
    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[256];

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed;
        consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        if ((tls->in_handshake) && (consumed))
            break;
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
        break;
    default:
        /* flush partially written response */
        ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
        emitter.super.buf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }
    if (!tls->in_handshake)
        *inlen -= src_end - src;
    return ret;
}